

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O2

void __thiscall discordpp::Interaction::Interaction(Interaction *this,json *j)

{
  (this->id).t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false> =
       (_Head_base<0UL,_discordpp::Snowflake_*,_false>)0x0;
  (this->id).s_ = uninitialized_e;
  (this->application_id).t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = (Snowflake *)0x0;
  (this->application_id).s_ = uninitialized_e;
  (this->type).t_._M_t.
  super___uniq_ptr_impl<discordpp::InteractionType,_std::default_delete<discordpp::InteractionType>_>
  ._M_t.
  super__Tuple_impl<0UL,_discordpp::InteractionType_*,_std::default_delete<discordpp::InteractionType>_>
  .super__Head_base<0UL,_discordpp::InteractionType_*,_false>._M_head_impl = (InteractionType *)0x0;
  (this->type).s_ = uninitialized_e;
  omittable_field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
  ::omittable_field(&this->data);
  omittable_field<discordpp::Snowflake>::omittable_field(&this->guild_id);
  omittable_field<discordpp::Snowflake>::omittable_field(&this->channel_id);
  omittable_field<discordpp::GuildMember>::omittable_field(&this->member);
  omittable_field<discordpp::User>::omittable_field(&this->user);
  (this->token).t_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (this->token).s_ = uninitialized_e;
  (this->version).t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (int *)0x0;
  (this->version).s_ = uninitialized_e;
  omittable_field<discordpp::Message>::omittable_field(&this->message);
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::omittable_field(&this->app_permissions);
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::omittable_field(&this->locale);
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::omittable_field(&this->guild_locale);
  discordpp::from_json(j,this);
  return;
}

Assistant:

Interaction(const json &j) { from_json(j, *this); }